

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE pRVar4;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  REF_ADJ_ITEM pRVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double __x;
  double dVar15;
  double dVar16;
  REF_DBL RVar17;
  REF_DBL dx2 [3];
  REF_DBL dx1 [3];
  int local_90;
  double local_68 [4];
  double local_48 [3];
  
  pRVar4 = ref_grid->node;
  pRVar5 = ref_grid->cell[0];
  *angle = 180.0;
  uVar11 = 0xffffffff;
  if (-1 < node) {
    uVar11 = 0xffffffff;
    if (node < pRVar5->ref_adj->nnode) {
      uVar11 = (ulong)(uint)pRVar5->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar11 != -1) {
    iVar13 = pRVar5->ref_adj->item[(int)uVar11].ref;
    do {
      iVar10 = -1;
      uVar14 = 0xffffffff;
      if (-1 < node) {
        uVar14 = 0xffffffff;
        if (node < pRVar5->ref_adj->nnode) {
          uVar14 = (ulong)(uint)pRVar5->ref_adj->first[(uint)node];
        }
      }
      if ((int)uVar14 != -1) {
        iVar10 = pRVar5->ref_adj->item[(int)uVar14].ref;
      }
      while ((int)uVar14 != -1) {
        if (iVar13 != iVar10) {
          pRVar6 = pRVar5->c2n;
          lVar12 = (long)(pRVar5->size_per * iVar13);
          iVar1 = pRVar6[lVar12];
          iVar2 = pRVar6[lVar12 + 1];
          lVar12 = (long)(iVar10 * pRVar5->size_per);
          iVar10 = pRVar6[lVar12];
          iVar3 = pRVar6[lVar12 + 1];
          pRVar7 = pRVar4->real;
          lVar12 = 0;
          do {
            local_48[lVar12] =
                 pRVar7[((iVar1 - node) + iVar2) * 0xf + lVar12] - pRVar7[node * 0xf + lVar12];
            local_68[lVar12] =
                 pRVar7[((iVar10 - node) + iVar3) * 0xf + lVar12] - pRVar7[node * 0xf + lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          uVar9 = ref_math_normalize(local_48);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xa5c,"ref_geom_node_min_angle",(ulong)uVar9,"dx1");
            return uVar9;
          }
          uVar9 = ref_math_normalize(local_68);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xa5d,"ref_geom_node_min_angle",(ulong)uVar9,"dx2");
            return uVar9;
          }
          __x = local_48[2] * local_68[2] + local_48[0] * local_68[0] + local_48[1] * local_68[1];
          dVar16 = *angle;
          dVar15 = acos(__x);
          if ((dVar15 * 180.0) / 3.14159265358979 <= dVar16) {
            dVar16 = acos(__x);
            RVar17 = (dVar16 * 180.0) / 3.14159265358979;
          }
          else {
            RVar17 = *angle;
          }
          *angle = RVar17;
        }
        pRVar8 = pRVar5->ref_adj->item;
        uVar14 = (ulong)pRVar8[(int)uVar14].next;
        if (uVar14 == 0xffffffffffffffff) {
          iVar10 = -1;
        }
        else {
          iVar10 = pRVar8[uVar14].ref;
        }
      }
      pRVar8 = pRVar5->ref_adj->item;
      local_90 = (int)uVar11;
      iVar10 = pRVar8[local_90].next;
      uVar11 = (ulong)iVar10;
      if (uVar11 == 0xffffffffffffffff) {
        iVar13 = -1;
      }
      else {
        iVar13 = pRVar8[uVar11].ref;
      }
    } while (iVar10 != -1);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,
                                                  REF_INT node,
                                                  REF_DBL *angle) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item1, cell1, node1;
  REF_INT item2, cell2, node2;
  REF_INT i;
  REF_DBL dot, dx1[3], dx2[3];
  *angle = 180.0;
  each_ref_cell_having_node(ref_cell, node, item1, cell1) {
    each_ref_cell_having_node(ref_cell, node, item2, cell2) {
      if (cell1 == cell2) continue; /* skip same edge */
      node1 = ref_cell_c2n(ref_cell, 0, cell1) +
              ref_cell_c2n(ref_cell, 1, cell1) - node;
      node2 = ref_cell_c2n(ref_cell, 0, cell2) +
              ref_cell_c2n(ref_cell, 1, cell2) - node;
      for (i = 0; i < 3; i++) {
        dx1[i] =
            ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
        dx2[i] =
            ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
      }
      RSS(ref_math_normalize(dx1), "dx1");
      RSS(ref_math_normalize(dx2), "dx2");
      dot = ref_math_dot(dx1, dx2);
      *angle = MIN(*angle, ref_math_in_degrees(acos(dot)));
    }
  }
  return REF_SUCCESS;
}